

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureGatherTests.cpp
# Opt level: O3

GLvoid __thiscall
glcts::anon_unknown_0::GatherBase::CreateTexture2DArray(GatherBase *this,int slices,int data_slice)

{
  CallLogWrapper *pCVar1;
  int zoffset;
  int iVar2;
  GLenum format;
  undefined4 extraout_var;
  uint width;
  allocator_type local_a1;
  CallLogWrapper *local_a0;
  int local_94;
  undefined8 local_90;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  value_type local_48;
  
  local_94 = data_slice;
  iVar2 = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])();
  local_90 = CONCAT44(extraout_var,iVar2);
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  pCVar1 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(pCVar1,1,&this->tex);
  local_a0 = pCVar1;
  glu::CallLogWrapper::glBindTexture(pCVar1,0x8c1a,this->tex);
  width = 0x20;
  iVar2 = 0;
  do {
    local_48.m_data[0] = 1.0;
    local_48.m_data[1] = 1.0;
    local_48.m_data[2] = 1.0;
    local_48.m_data[3] = 1.0;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              (&pixels,(long)(int)(width * slices * width),&local_48,&local_a1);
    glu::CallLogWrapper::glTexImage3D
              (local_a0,0x8c1a,iVar2,(GLint)local_90,width,width,slices,0,format,0x1406,
               pixels.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_start);
    if (pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(pixels.
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)pixels.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)pixels.
                            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    zoffset = local_94;
    pCVar1 = local_a0;
    iVar2 = iVar2 + 1;
    width = width >> 1;
  } while (iVar2 != 6);
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3f5000003f400000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x3f7000003f600000;
  pixels.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x3f1000003f000000;
  local_68 = 0x3d80000000000000;
  uStack_60 = 0x3e4000003e000000;
  local_58 = 0x3ea000003e800000;
  uStack_50 = 0x3ee000003ec00000;
  glu::CallLogWrapper::glTexSubImage3D
            (local_a0,0x8c1a,0,0x16,0x19,local_94,2,2,1,format,0x1406,&pixels);
  glu::CallLogWrapper::glTexSubImage3D(pCVar1,0x8c1a,0,0x10,10,zoffset,1,1,1,format,0x1406,&pixels);
  glu::CallLogWrapper::glTexSubImage3D
            (pCVar1,0x8c1a,0,0xb,2,zoffset,1,1,1,format,0x1406,
             &pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  glu::CallLogWrapper::glTexSubImage3D
            (pCVar1,0x8c1a,0,0x18,0xd,zoffset,1,1,1,format,0x1406,&local_68);
  glu::CallLogWrapper::glTexSubImage3D(pCVar1,0x8c1a,0,9,0xe,zoffset,1,1,1,format,0x1406,&local_58);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x8072,0x812f);
  pCVar1 = local_a0;
  iVar2 = (int)local_90;
  if (iVar2 < 0x8814) {
    if ((iVar2 != 0x822e) && (iVar2 != 0x8230)) {
      return;
    }
  }
  else if ((1 < iVar2 - 0x8814U) && (iVar2 != 0x8cac)) {
    return;
  }
  glu::CallLogWrapper::glTexParameteri(local_a0,0x8c1a,0x2800,0x2600);
  glu::CallLogWrapper::glTexParameteri(pCVar1,0x8c1a,0x2801,0x2700);
  return;
}

Assistant:

virtual GLvoid CreateTexture2DArray(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			std::vector<Vec4> pixels(size * size * slices, Vec4(1.0));
			glTexImage3D(GL_TEXTURE_2D_ARRAY, i, internal_format, size, size, slices, 0, format, GL_FLOAT, &pixels[0]);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 22, 25, data_slice, 2, 2, 1, format, GL_FLOAT, data);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 16, 10, data_slice, 1, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 11, 2, data_slice, 1, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 24, 13, data_slice, 1, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage3D(GL_TEXTURE_2D_ARRAY, 0, 9, 14, data_slice, 1, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (IsFloatingPointTexture(internal_format))
		{
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
		}
	}